

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O1

void __thiscall
chrono::ChFile_ps::DrawGraphLabel
          (ChFile_ps *this,double dx,double dy,double fontsize,char *label,int dolinesample,
          bool background,double backwidth,ChFile_ps_color bkgndcolor)

{
  ChStreamOutAscii *this_00;
  undefined1 auVar1 [16];
  double dVar2;
  undefined8 uVar3;
  double size;
  bool bVar4;
  ChStreamOutAscii *this_01;
  undefined7 in_register_00000009;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar9 [64];
  double local_d0;
  double local_b8;
  ChVector2<double> local_98;
  ChVector2<double> local_88;
  ChVector2<double> local_78;
  ChVector2<double> local_68;
  ChVector2<double> local_58;
  ChVector2<double> local_48;
  ChVector2<double> local_38;
  
  auVar9._8_56_ = in_register_00001288;
  auVar9._0_8_ = fontsize;
  uVar3 = vcmpsd_avx512f(auVar9._0_16_,ZEXT816(0),0);
  bVar4 = (bool)((byte)uVar3 & 1);
  size = (double)((ulong)bVar4 * 0x3fd3333333333333 + (ulong)!bVar4 * (long)fontsize);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = size;
  dVar2 = dy + (this->G_p).m_data[1] + 0.0;
  local_d0 = dx + (this->G_p).m_data[0];
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar5 = vxorpd_avx512vl(auVar8,auVar5);
  this_00 = &(this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii;
  ChStreamOutAscii::operator<<(this_00,"GS\n");
  local_38.m_data[0] = (this->G_p).m_data[0];
  local_38.m_data[1] = (this->G_p).m_data[1];
  local_48.m_data[0] = (this->Gs_p).m_data[0];
  local_48.m_data[1] = (this->Gs_p).m_data[1];
  ClipRectangle(this,&local_38,&local_48,PAGE);
  SetFont(this,"/Times-Italic",size);
  if ((int)CONCAT71(in_register_00000009,background) != 0) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar2;
    local_b8 = auVar5._0_8_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_b8;
    auVar8 = vfmadd132sd_fma(ZEXT816(0x3fe6666666666666),auVar6,auVar1);
    ChStreamOutAscii::operator<<(this_00,"GS\n");
    SetRGB(this,bkgndcolor.r,bkgndcolor.g,bkgndcolor.b);
    local_68.m_data[0] = backwidth;
    local_68.m_data[1] = size * 1.4;
    local_58.m_data[0] = local_d0;
    local_58.m_data[1] = auVar8._0_8_;
    DrawRectangle(this,&local_58,&local_68,PAGE,true);
    ChStreamOutAscii::operator<<(this_00,"GR\n");
  }
  if (dolinesample != 0) {
    local_78.m_data[0] = local_d0 + 0.08;
    local_88.m_data[0] = local_d0 + 0.6;
    local_88.m_data[1] = dVar2;
    local_78.m_data[1] = dVar2;
    DrawLine(this,&local_78,&local_88,PAGE);
    local_d0 = local_d0 + 0.6 + 0.3;
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar2;
  auVar5 = vfmadd213sd_fma(auVar5,ZEXT816(0) << 0x40,auVar7);
  this_01 = ChStreamOutAscii::operator<<(this_00,0.0);
  ChStreamOutAscii::operator<<(this_01," SG\n");
  local_98.m_data[0] = local_d0;
  local_b8 = auVar5._0_8_;
  local_98.m_data[1] = local_b8;
  DrawText(this,&local_98,label,PAGE,LEFT);
  ChStreamOutAscii::operator<<(this_00,"GR\n");
  return;
}

Assistant:

void ChFile_ps::DrawGraphLabel(double dx,
                               double dy,
                               double fontsize,
                               char* label,
                               int dolinesample,
                               bool background,
                               double backwidth,
                               ChFile_ps_color bkgndcolor) {
    if (fontsize == 0)
        fontsize = 0.3;
    ChVector2<> mp1, mp2, mp3;
    mp3.y() = G_p.y() + dy;
    mp1.y() = mp3.y() + 0.0;
    mp2.y() = mp1.y();
    mp1.x() = G_p.x() + dx;
    mp2.x() = G_p.x() + dx + 0.6;
    ChVector2<> mpa, mpb;
    mpa = mp1;
    mpa.y() -= fontsize * 0.7;
    mpb.x() = backwidth;
    mpb.y() = fontsize * 1.4;

    GrSave();
    ClipToGraph();
    SetFont((char*)"/Times-Italic", fontsize);

    if (background) {
        GrSave();
        SetRGB(bkgndcolor);
        DrawRectangle(mpa, mpb, Space::PAGE, true);
        GrRestore();
    }
    if (dolinesample) {
        mp1.x() += 0.08;
        DrawLine(mp1, mp2, Space::PAGE);
        mp3.x() = mp2.x() + 0.3;
    } else {
        mp3.x() = mp1.x();
    }
    mp3.y() = mp1.y() - fontsize * 0.0;
    SetGray(0.0);
    DrawText(mp3, label, Space::PAGE);

    GrRestore();
}